

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# address.cpp
# Opt level: O0

Error * __thiscall
ot::commissioner::Address::Set(Error *__return_storage_ptr__,Address *this,string *aIp)

{
  int iVar1;
  char *pcVar2;
  uchar *puVar3;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  basic_string_view<char> bVar4;
  format_args args;
  string_view fmt;
  anon_class_1_0_00000001 local_15a;
  v10 local_159;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_158;
  char *local_150;
  string local_148;
  Error local_128;
  undefined1 local_f0 [8];
  ByteArray bytes;
  string *aIp_local;
  Address *this_local;
  Error *error;
  undefined1 local_a0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_90;
  char *local_88;
  string *local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_78;
  char *pcStack_70;
  string *local_68;
  v10 *local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_48;
  char *pcStack_40;
  Error **local_38;
  undefined1 *local_30;
  Error **local_28;
  undefined8 local_20;
  undefined1 *local_18;
  Error **local_10;
  
  bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
  Error::Error(__return_storage_ptr__);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_f0);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_f0,4);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  puVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_f0);
  iVar1 = inet_pton(2,pcVar2,puVar3);
  if (iVar1 != 1) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_f0,0x10);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    puVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_f0);
    iVar1 = inet_pton(10,pcVar2,puVar3);
    if (iVar1 != 1) {
      Set::anon_class_1_0_00000001::operator()(&local_15a);
      local_58 = &local_158;
      local_60 = &local_159;
      bVar4 = ::fmt::v10::operator()(local_60);
      local_150 = (char *)bVar4.size_;
      local_158 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)bVar4.data_;
      ::fmt::v10::detail::
      check_format_string<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_FMT_COMPILE_STRING,_0>
                ();
      local_68 = &local_148;
      local_78 = local_158;
      pcStack_70 = local_150;
      local_50 = &local_78;
      local_90 = local_158;
      local_88 = local_150;
      local_80 = aIp;
      local_48 = local_90;
      pcStack_40 = local_88;
      error = (Error *)::fmt::v10::
                       make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,std::__cxx11::string_const>
                                 ((format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   *)aIp,(v10 *)local_68,local_158);
      local_30 = local_a0;
      local_38 = &error;
      local_20 = 0xd;
      args.field_1.values_ = in_R9.values_;
      args.desc_ = (unsigned_long_long)local_38;
      fmt.size_ = 0xd;
      fmt.data_ = local_88;
      local_28 = local_38;
      local_18 = local_30;
      local_10 = local_38;
      ::fmt::v10::vformat_abi_cxx11_(&local_148,(v10 *)local_90,fmt,args);
      Error::Error(&local_128,kInvalidArgs,&local_148);
      Error::operator=(__return_storage_ptr__,&local_128);
      Error::~Error(&local_128);
      std::__cxx11::string::~string((string *)&local_148);
      goto LAB_0020f818;
    }
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            (&this->mBytes,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_f0);
LAB_0020f818:
  bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_f0);
  if ((bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage._7_1_ & 1) == 0) {
    Error::~Error(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

Error Address::Set(const std::string &aIp)
{
    Error     error;
    ByteArray bytes;

    bytes.resize(kIpv4Size);
    if (inet_pton(AF_INET, aIp.c_str(), bytes.data()) != 1)
    {
        bytes.resize(kIpv6Size);
        if (inet_pton(AF_INET6, aIp.c_str(), bytes.data()) != 1)
        {
            ExitNow(error = ERROR_INVALID_ARGS("{} is not a valid IP address", aIp));
        }
    }

    mBytes = bytes;

exit:
    return error;
}